

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

find_escape_result<char> * fmt::v9::detail::find_escape(char *begin,char *end)

{
  type count;
  char *in_RDX;
  char *in_RSI;
  find_escape_result<char> *in_RDI;
  anon_class_8_1_6971b95b_for_f unaff_retaddr;
  string_view in_stack_00000008;
  find_escape_result<char> *result;
  basic_string_view<char> local_20 [2];
  
  in_RDI->begin = in_RDX;
  in_RDI->end = (char *)0x0;
  in_RDI->cp = 0;
  count = to_unsigned<long>(0x1f648e);
  basic_string_view<char>::basic_string_view(local_20,in_RSI,count);
  for_each_codepoint<fmt::v9::detail::find_escape(char_const*,char_const*)::_lambda(unsigned_int,fmt::v9::basic_string_view<char>)_1_>
            (in_stack_00000008,unaff_retaddr);
  return in_RDI;
}

Assistant:

inline auto find_escape(const char* begin, const char* end)
    -> find_escape_result<char> {
  if (!is_utf8()) return find_escape<char>(begin, end);
  auto result = find_escape_result<char>{end, nullptr, 0};
  for_each_codepoint(string_view(begin, to_unsigned(end - begin)),
                     [&](uint32_t cp, string_view sv) {
                       if (needs_escape(cp)) {
                         result = {sv.begin(), sv.end(), cp};
                         return false;
                       }
                       return true;
                     });
  return result;
}